

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O0

void __thiscall
sc_core::sc_vector_base::report_empty_bind(sc_vector_base *this,char *kind_,bool dst_empty_)

{
  ostream *poVar1;
  char *pcVar2;
  size_type sVar3;
  byte in_DL;
  char *in_RSI;
  stringstream str;
  string local_1d0 [48];
  stringstream local_1a0 [4];
  int in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  sc_severity in_stack_fffffffffffffe84;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe70,"target `");
  pcVar2 = sc_object::name((sc_object *)0x2f44ee);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\' ");
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::operator<<(poVar1,in_RSI);
  std::operator<<(poVar1,") ");
  sVar3 = size((sc_vector_base *)0x2f4571);
  if (sVar3 == 0) {
    std::operator<<((ostream *)&stack0xfffffffffffffe70,"not initialised yet");
  }
  else if ((in_DL & 1) == 0) {
    std::operator<<((ostream *)&stack0xfffffffffffffe70,"empty destination range given");
  }
  else {
    std::operator<<((ostream *)&stack0xfffffffffffffe70,"empty range given");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  sc_report_handler::report
            (in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void
sc_vector_base::report_empty_bind( const char* kind_, bool dst_empty_ ) const
{
  std::stringstream str;

  str << "target `" << name() << "' "
      << "(" << kind_ << ") ";

  if( !size() ) {
    str << "not initialised yet";
  } else if ( dst_empty_ ) {
    str << "empty range given";
  } else {
    str << "empty destination range given";
  }

  SC_REPORT_WARNING( SC_ID_VECTOR_BIND_EMPTY_, str.str().c_str() );
}